

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index_buffered_region.cc
# Opt level: O1

void __thiscall
S2ShapeIndexBufferedRegion::GetCellUnionBound
          (S2ShapeIndexBufferedRegion *this,vector<S2CellId,_std::allocator<S2CellId>_> *cellids)

{
  pointer pSVar1;
  ulong uVar2;
  S1Angle value;
  pointer pSVar3;
  bool bVar4;
  int iVar5;
  int level;
  pointer pSVar6;
  long lVar7;
  vector<S2CellId,_std::allocator<S2CellId>_> orig_cellids;
  S2CellId id;
  undefined1 local_90 [16];
  VType local_80;
  _Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false> _Stack_78;
  S1ChordAngle local_70;
  vector<S2CellId,_std::allocator<S2CellId>_> local_68;
  _func_int **local_50;
  S2CellId local_48;
  S2LogMessage local_40;
  
  local_68.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_68.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_68.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_90._8_8_ = (this->query_).base_.index_;
  local_90._0_8_ = &PTR__S2ShapeIndexRegion_002c2828;
  local_80 = (VType)CONCAT44(local_80._4_4_,SEMI_OPEN);
  (*((ostream *)local_90._8_8_)->_vptr_basic_ostream[6])(&_Stack_78,local_90._8_8_,2);
  local_70.length2_ = (double)&_Stack_78;
  S2ShapeIndexRegion<S2ShapeIndex>::GetCellUnionBound
            ((S2ShapeIndexRegion<S2ShapeIndex> *)local_90,&local_68);
  if (_Stack_78._M_head_impl != (IteratorBase *)0x0) {
    (*(_Stack_78._M_head_impl)->_vptr_IteratorBase[1])();
  }
  value = S1ChordAngle::ToAngle(&this->radius_);
  iVar5 = S2::Metric<1>::GetLevelForMinValue((Metric<1> *)&S2::kMinWidth,value.radians_);
  pSVar3 = local_68.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (iVar5 < 1) {
    S1ChordAngle::S1ChordAngle(&local_70,4.0);
    local_90._0_8_ = &PTR__S2Region_002c1748;
    local_90._8_8_ = (ostream *)0x3ff0000000000000;
    local_80 = 0.0;
    _Stack_78._M_head_impl = (IteratorBase *)0x0;
    bVar4 = S2::IsUnitLength((S2Point *)(local_90 + 8));
    if (!bVar4 || 4.0 < local_70.length2_) {
      S2LogMessage::S2LogMessage
                (&local_40,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cap.h"
                 ,0xf5,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_40.stream_,"Check failed: is_valid() ",0x19);
LAB_00225669:
      abort();
    }
    S2Cap::GetCellUnionBound((S2Cap *)local_90,cellids);
  }
  else {
    pSVar1 = (cellids->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((cellids->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
        super__Vector_impl_data._M_finish != pSVar1) {
      (cellids->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
      super__Vector_impl_data._M_finish = pSVar1;
    }
    if (local_68.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_68.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_50 = (_func_int **)&PTR__S2Region_002c1748;
      pSVar1 = local_68.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        pSVar6 = pSVar1 + 1;
        local_48.id_ = pSVar1->id_;
        lVar7 = local_48.id_ << 4;
        if (lVar7 == 0) {
          S1ChordAngle::S1ChordAngle(&local_70,4.0);
          local_90._0_8_ = local_50;
          local_90._8_8_ = (ostream *)0x3ff0000000000000;
          local_80 = 0.0;
          _Stack_78._M_head_impl = (IteratorBase *)0x0;
          bVar4 = S2::IsUnitLength((S2Point *)(local_90 + 8));
          if (!bVar4 || 4.0 < local_70.length2_) {
            S2LogMessage::S2LogMessage
                      (&local_40,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cap.h"
                       ,0xf5,kFatal,(ostream *)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_40.stream_,"Check failed: is_valid() ",0x19);
            goto LAB_00225669;
          }
          S2Cap::GetCellUnionBound((S2Cap *)local_90,cellids);
        }
        else {
          if (local_48.id_ == 0) {
            S2LogMessage::S2LogMessage
                      ((S2LogMessage *)local_90,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_id.h"
                       ,0x223,kFatal,(ostream *)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_90._8_8_,"Check failed: id_ != 0 ",0x17);
            goto LAB_00225669;
          }
          uVar2 = 0;
          if (local_48.id_ != 0) {
            for (; (local_48.id_ >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
            }
          }
          level = 0x1d - ((uint)(uVar2 >> 1) & 0x7fffffff);
          if (iVar5 + -1 <= level) {
            level = iVar5 + -1;
          }
          S2CellId::AppendVertexNeighbors(&local_48,level,cellids);
        }
      } while ((lVar7 != 0) && (pSVar1 = pSVar6, pSVar6 != pSVar3));
    }
  }
  if (local_68.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void S2ShapeIndexBufferedRegion::GetCellUnionBound(vector<S2CellId> *cellids)
    const {
  // We start with a covering of the original S2ShapeIndex, and then expand it
  // by replacing each cell with a block of 4 cells whose union contains the
  // original cell buffered by the given radius.
  //
  // This increases the number of cells in the covering by a factor of 4 and
  // increases the covered area by a factor of 16, so it is not a very good
  // covering, but it is much better than always returning the 6 face cells.
  vector<S2CellId> orig_cellids;
  MakeS2ShapeIndexRegion(&index()).GetCellUnionBound(&orig_cellids);

  double radians = radius_.ToAngle().radians();
  int max_level = S2::kMinWidth.GetLevelForMinValue(radians) - 1;
  if (max_level < 0) {
    return S2Cap::Full().GetCellUnionBound(cellids);
  }
  cellids->clear();
  for (S2CellId id : orig_cellids) {
    if (id.is_face()) {
      return S2Cap::Full().GetCellUnionBound(cellids);
    }
    id.AppendVertexNeighbors(min(max_level, id.level() - 1), cellids);
  }
}